

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_sub.cpp
# Opt level: O3

int64_t duckdb::DateSub::MillisecondsOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                  (date_t startdate,date_t enddate)

{
  timestamp_t timestamp;
  timestamp_t timestamp_00;
  int64_t right;
  int64_t left;
  long lVar1;
  
  timestamp = Timestamp::FromDatetime(startdate,(dtime_t)0x0);
  timestamp_00 = Timestamp::FromDatetime(enddate,(dtime_t)0x0);
  right = Timestamp::GetEpochMicroSeconds(timestamp);
  left = Timestamp::GetEpochMicroSeconds(timestamp_00);
  lVar1 = SubtractOperatorOverflowCheck::Operation<long,long,long>(left,right);
  return lVar1 / 1000;
}

Assistant:

int64_t DateSub::MillisecondsOperator::Operation(date_t startdate, date_t enddate) {
	dtime_t t0(0);
	return MillisecondsOperator::Operation<timestamp_t, timestamp_t, int64_t>(Timestamp::FromDatetime(startdate, t0),
	                                                                          Timestamp::FromDatetime(enddate, t0));
}